

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O3

bool __thiscall soul::Value::PackedData::getAsBool(PackedData *this)

{
  Category CVar1;
  Primitive PVar2;
  Type *pTVar3;
  int64_t iVar4;
  bool bVar5;
  double dVar6;
  
  pTVar3 = this->type;
  CVar1 = pTVar3->category;
  if (((5 < CVar1) || ((0x32U >> (CVar1 & 0x1f) & 1) == 0)) &&
     ((CVar1 != vector || (pTVar3->boundingSize != 1)))) {
    throwInternalCompilerError
              ("type.isPrimitive() || type.isBoundedInt() || type.isVectorOfSize1()","getAsBool",
               0x8b);
  }
  PVar2 = (pTVar3->primitiveType).type;
  if (PVar2 == bool_) {
    if (this->size != 1) {
      throwInternalCompilerError("size == sizeof (Primitive)","getAs",0x15e);
    }
    bVar5 = *this->data == '\0';
  }
  else {
    if (1 < PVar2 - int32) {
      if ((PVar2 & ~void_) == float32) {
        dVar6 = getAsDouble(this);
        return (bool)(-(dVar6 != 0.0) & 1);
      }
      throwInternalCompilerError("getAsBool",0x91);
    }
    iVar4 = getAsInt64(this);
    bVar5 = iVar4 == 0;
  }
  return !bVar5;
}

Assistant:

bool getAsBool() const
    {
        SOUL_ASSERT (type.isPrimitive() || type.isBoundedInt() || type.isVectorOfSize1());

        if (type.isBool())           return getAs<uint8_t>() != 0;
        if (type.isInteger())        return getAsInt64() != 0;
        if (type.isFloatingPoint())  return getAsDouble() != 0;

        SOUL_ASSERT_FALSE;
        return false;
    }